

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::SearchSmallAndLarge(PageHeap *this,uint64_t n)

{
  bool bVar1;
  Span *pSVar2;
  ulong local_30;
  uint64_t i;
  Span *span;
  uint64_t n_local;
  PageHeap *this_local;
  
  local_30 = n;
  while( true ) {
    if (0x7f < local_30) {
      pSVar2 = AllocLarge(this,n);
      return pSVar2;
    }
    bVar1 = ListEmpty(this->small_normal_ + local_30);
    if (!bVar1) break;
    bVar1 = ListEmpty(this->small_returned_ + local_30);
    if (!bVar1) {
      pSVar2 = this->small_returned_[local_30].next;
      RemoveFromFreeList(this,pSVar2);
      bVar1 = CheckSmallList(this);
      if (bVar1) {
        return pSVar2;
      }
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0xae,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
    }
    local_30 = local_30 + 1;
  }
  pSVar2 = this->small_normal_[local_30].next;
  RemoveFromFreeList(this,pSVar2);
  bVar1 = CheckSmallList(this);
  if (bVar1) {
    return pSVar2;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0xa7,"Span *tcmalloc::PageHeap::SearchSmallAndLarge(uint64_t)");
}

Assistant:

Span* SearchSmallAndLarge(uint64_t n) {
        Span* span = nullptr;
        for (uint64_t i = n; i <= spanSmallPages; ++i) {
            if (!ListEmpty(&small_normal_[i])) {
                span = small_normal_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }

            if (!ListEmpty(&small_returned_[i])) {
                span = small_returned_[i].next;
                RemoveFromFreeList(span);
                assert(CheckSmallList());
                return span;
            }
        }
        return AllocLarge(n);
    }